

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O2

_Bool build_huge(chunk *c,loc_conflict centre,wchar_t rating)

{
  ulong uVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  wchar_t x1;
  uint32_t uVar6;
  wchar_t w;
  int iVar7;
  ulong uVar8;
  wchar_t wVar9;
  wchar_t h;
  bool bVar10;
  loc_conflict centre_local;
  
  bVar10 = true;
  if (centre.y < c->height) {
    bVar10 = c->width <= centre.x;
  }
  centre_local = centre;
  uVar3 = Rand_div(10);
  uVar4 = Rand_div(0x32);
  if ((dun->cent_n - dun->nstair_room <= (int)(uint)(bVar10 ^ 1)) &&
     (uVar5 = Rand_div(0x14), uVar5 == 0)) {
    h = uVar3 + L'\x1e';
    w = uVar4 + L'-';
    uVar5 = Rand_div(3);
    event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,h,w);
    wVar9 = centre.y;
    if (bVar10 != false) {
      _Var2 = find_space(&centre_local,h,w);
      if (!_Var2) {
        return false;
      }
      centre = (loc_conflict)((ulong)centre_local & 0xffffffff);
      wVar9 = centre_local.y;
    }
    wVar9 = h / -2 + wVar9;
    x1 = w / -2 + centre.x;
    _Var2 = generate_starburst_room
                      (c,wVar9,x1,uVar3 + wVar9 + L'\x1d',uVar4 + 0x2c + x1,uVar5 != 0,L'\x01',false
                      );
    if (_Var2) {
      uVar3 = Rand_div(5);
      if (1 < (int)uVar3) {
        event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"rubble");
        uVar3 = Rand_div(2);
        uVar1 = (long)((uVar3 + 1) * w * h) / 0x44c;
        uVar8 = uVar1 & 0xffffffff;
        if ((int)uVar1 < 1) {
          uVar8 = 0;
        }
        while (iVar7 = (int)uVar8, uVar8 = (ulong)(iVar7 - 1), iVar7 != 0) {
          uVar3 = Rand_div(0x10);
          uVar4 = Rand_div(0x18);
          uVar5 = Rand_div(h - (uVar3 + 8));
          uVar6 = Rand_div(w - (uVar4 + 10));
          generate_starburst_room
                    (c,uVar5 + wVar9,uVar6 + x1,uVar3 + uVar5 + wVar9 + L'\b',
                     uVar4 + 10 + uVar6 + x1,false,L'\x18',false);
        }
      }
      if ((player->opts).opt[0x18] == true) {
        msg("Huge room");
        return true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool build_huge(struct chunk *c, struct loc centre, int rating)
{
	bool finding_space = centre.y >= c->height || centre.x >= c->width;
	bool light;

	int i, count;

	int y1, x1, y2, x2;
	int y1_tmp, x1_tmp, y2_tmp, x2_tmp;
	int width_tmp, height_tmp;

	int height = 30 + randint0(10);
	int width = 45 + randint0(50);

	/*
	 * Only try to build a huge room as the first non-staircase room.  If
	 * not finding space, cent_n has already been increment.
	 */
	if (dun->cent_n - dun->nstair_room > ((finding_space) ? 0 : 1))
		return false;

	/* Flat 5% chance */
	if (!one_in_(20)) return false;

	/* This room is usually lit. */
	light = !one_in_(3);

	/* Find and reserve some space.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height, width);
	if (finding_space) {
		if (!find_space(&centre, height, width))
			return (false);
	}

	/* Locate the room */
	y1 = centre.y - height / 2;
	x1 = centre.x - width / 2;
	y2 = y1 + height - 1;
	x2 = x1 + width - 1;

	/* Make a huge starburst room with optional light. */
	if (!generate_starburst_room(c, y1, x1, y2, x2, light, FEAT_FLOOR, false))
		return (false);

	/* Often, add rubble to break things up a bit. */
	if (randint1(5) > 2) {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "rubble");

		/* Determine how many rubble fields to add (between 1 and 6). */
		count = height * width * randint1(2) / 1100;

		/* Make the rubble fields. */
		for (i = 0; i < count; i++) {
			height_tmp = 8 + randint0(16);
			width_tmp = 10 + randint0(24);

			/* Semi-random location. */
			y1_tmp = y1 + randint0(height - height_tmp);
			x1_tmp = x1 + randint0(width - width_tmp);
			y2_tmp = y1_tmp + height_tmp;
			x2_tmp = x1_tmp + width_tmp;

			/* Make the rubble field. */
			generate_starburst_room(c, y1_tmp, x1_tmp, y2_tmp, x2_tmp,
									false, FEAT_PASS_RUBBLE, false);
		}
	}

	/* Describe */
	ROOM_LOG("Huge room");

	/* Success. */
	return (true);
}